

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
ConvertToNonSharedSimpleDictionaryType
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance)

{
  ScriptContext *pSVar1;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *local_30;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *newTypeHandler;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  if (((byte)this->field_0x28 >> 1 & 1) == 0) {
    local_30 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
               SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
               ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>,Js::PropertyRecord_const*>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                          this,instance);
  }
  else {
    local_30 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
               ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,false>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                          this,instance);
  }
  pSVar1 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar1->convertSimpleSharedDictionaryToNonSharedCount =
       pSVar1->convertSimpleSharedDictionaryToNonSharedCount + 1;
  return &local_30->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToNonSharedSimpleDictionaryType(DynamicObject* instance)
    {
        // Although an unordered type handler is never actually shared, it can be flagged as shared by type snapshot enumeration
        // to freeze the initial type handler before enumeration commences
        SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* newTypeHandler =
            isUnordered
                ? ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                : ConvertToTypeHandler<SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>, TMapKey>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleSharedDictionaryToNonSharedCount++;
#endif
        return newTypeHandler;
    }